

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  undefined1 local_178 [8];
  MidiFile midifile;
  undefined1 local_f8 [8];
  Options options;
  char **argv_local;
  int argc_local;
  
  options.m_extraArgv_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  smf::Options::Options((Options *)local_f8);
  checkOptions((Options *)local_f8,argc,
               (char **)options.m_extraArgv_strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  smf::MidiFile::MidiFile((MidiFile *)local_178);
  iVar1 = smf::Options::getArgCount((Options *)local_f8);
  if (iVar1 < 1) {
    smf::MidiFile::read((MidiFile *)local_178,0x1803c8,__buf,in_RCX);
  }
  else {
    psVar2 = smf::Options::getArg_abi_cxx11_((Options *)local_f8,1);
    smf::MidiFile::read((MidiFile *)local_178,(int)psVar2,__buf_00,in_RCX);
  }
  addExpression_T100((MidiFile *)local_178);
  iVar1 = smf::Options::getArgCount((Options *)local_f8);
  if (iVar1 < 2) {
    operator<<((ostream *)&std::cout,(MidiFile *)local_178);
  }
  else {
    psVar2 = smf::Options::getArg_abi_cxx11_((Options *)local_f8,2);
    smf::MidiFile::write((MidiFile *)local_178,(int)psVar2,__buf_01,in_RCX);
  }
  smf::MidiFile::~MidiFile((MidiFile *)local_178);
  smf::Options::~Options((Options *)local_f8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	Options options;
	checkOptions(options, argc, argv);
	MidiFile midifile;
	if (options.getArgCount() > 0) {
		midifile.read(options.getArg(1));
	} else {
		midifile.read(cin);
	}
	addExpression_T100(midifile);
	if (options.getArgCount() >= 2) {
		midifile.write(options.getArg(2));
	} else {
		cout << midifile;
	}

	return 0;
}